

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ulong __thiscall smf::MidiFile::readVLValue(MidiFile *this,istream *input)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  int local_2c;
  byte local_25;
  int i;
  istream *piStack_20;
  uchar b [5];
  istream *input_local;
  MidiFile *this_local;
  
  piStack_20 = input;
  memset(&local_25,0,5);
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    bVar1 = readByte(this,piStack_20);
    (&local_25)[local_2c] = bVar1;
    bVar2 = status(this);
    if (!bVar2) {
      return (ulong)(this->m_rwstatus & 1);
    }
    if ((&local_25)[local_2c] < 0x80) break;
  }
  uVar3 = unpackVLV(this,local_25,(uchar)i,i._1_1_,i._2_1_,i._3_1_);
  return uVar3;
}

Assistant:

ulong MidiFile::readVLValue(std::istream& input) {
	uchar b[5] = {0};

	for (int i=0; i<5; i++) {
		b[i] = readByte(input);
		if (!status()) { return m_rwstatus; }
		if (b[i] < 0x80) {
			break;
		}
	}

	return unpackVLV(b[0], b[1], b[2], b[3], b[4]);
}